

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino_http.c
# Opt level: O1

dino_route_t *
list_method_find(dino_route_t *list,dino_http_method method,stack_char_ptr_t *url_stack)

{
  size_t sVar1;
  char **ppcVar2;
  byte *__s1;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  
  bVar3 = false;
  do {
    if (list == (dino_route_t *)0x0) {
      return (dino_route_t *)0x0;
    }
    if (list->method == method) {
      sVar1 = list->stack->count;
      if ((sVar1 == url_stack->count) && (bVar3 = true, sVar1 != 0)) {
        ppcVar2 = list->stack->pointers;
        sVar5 = 0;
        do {
          __s1 = (byte *)ppcVar2[sVar5];
          if (((*__s1 | 0x10) != 0x3a) &&
             (iVar4 = strcmp((char *)__s1,url_stack->pointers[sVar5]), iVar4 != 0)) {
            bVar3 = false;
            break;
          }
          sVar5 = sVar5 + 1;
        } while (sVar1 != sVar5);
      }
    }
    if (bVar3) {
      return list;
    }
    list = list->next;
  } while( true );
}

Assistant:

dino_route_t *list_method_find(dino_route_t *list, dino_http_method method, stack_char_ptr_t *url_stack) {
    bool match = false;

    while (NULL != list) {
        int index = 0;

        if (method == list->method) {
            // Do they have the same number of elements?
            //
            if (list->stack->count == url_stack->count) {
                // Assume that we have a match...
                //
                match = true;

                // Now compare the elements.
                //
                for (; index < list->stack->count && index < url_stack->count; index++) {
                    // If it is a wild card then assume it is good!
                    //
                    if (list->stack->pointers[index][0] == '*') {
                        continue;
                    }

                    // Do we have a :param element?
                    //
                    if (list->stack->pointers[index][0] == ':') {
                        continue;
                    }

                    // Ok see if they are the same string
                    //
                    if (0 != strcmp(list->stack->pointers[index], url_stack->pointers[index])) {
                        match = false;
                        break;
                    }
                }
            }
        }

        if (match) {
            break;
        }

        list = list->next;
    }

    return list;
}